

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_demultiplexer.h
# Opt level: O0

StreamDemultiplexer * __thiscall
StreamDemultiplexer::operator<<(StreamDemultiplexer *this,char (*obj) [31])

{
  bool bVar1;
  reference ppbVar2;
  __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
  local_28;
  __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
  local_20;
  iterator it;
  char (*obj_local) [31];
  StreamDemultiplexer *this_local;
  
  it._M_current = (basic_ostream<char,_std::char_traits<char>_> **)obj;
  local_20._M_current =
       (basic_ostream<char,_std::char_traits<char>_> **)
       std::
       vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
       ::begin(&this->d);
  while( true ) {
    local_28._M_current =
         (basic_ostream<char,_std::char_traits<char>_> **)
         std::
         vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
         ::end(&this->d);
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    ppbVar2 = __gnu_cxx::
              __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
              ::operator*(&local_20);
    std::operator<<(*ppbVar2,(char *)it._M_current);
    __gnu_cxx::
    __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
    ::operator++(&local_20);
  }
  return this;
}

Assistant:

StreamDemultiplexer& operator<<(const T& obj)
    {
        for (str_cont::iterator it = d.begin(); it != d.end(); ++it)
            (**it) << obj;
        return *this;
    }